

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O0

void __thiscall
cppcms::impl::
handler_binder_p0<void_(cppcms::impl::tcp_pipe::*)(),_std::shared_ptr<cppcms::impl::tcp_pipe>_>::
handler_binder_p0(handler_binder_p0<void_(cppcms::impl::tcp_pipe::*)(),_std::shared_ptr<cppcms::impl::tcp_pipe>_>
                  *this,offset_in_tcp_pipe_to_subr *f,shared_ptr<cppcms::impl::tcp_pipe> *s)

{
  element_type *peVar1;
  undefined8 *in_RSI;
  shared_ptr<cppcms::impl::tcp_pipe> *in_RDI;
  shared_ptr<cppcms::impl::tcp_pipe> *in_stack_ffffffffffffffd8;
  
  booster::callable<void_()>::callable((callable<void_()> *)in_RDI);
  (in_RDI->super___shared_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__handler_binder_p0_0052ed68;
  peVar1 = (element_type *)*in_RSI;
  in_RDI[1].super___shared_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  in_RDI[1].super___shared_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  std::shared_ptr<cppcms::impl::tcp_pipe>::shared_ptr(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

handler_binder_p0(F const &f,S const &s) : f_(f), s_(s) {}